

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_get_body_amqp_value_in_place(MESSAGE_HANDLE message,AMQP_VALUE *body_amqp_value)

{
  MESSAGE_BODY_TYPE MVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || body_amqp_value == (AMQP_VALUE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x4d8;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_body_amqp_value_in_place",0x4d7,1,
                "Bad arguments: message = %p, body_amqp_value = %p",message,body_amqp_value);
    }
  }
  else {
    MVar1 = internal_get_body_type(message);
    if (MVar1 == MESSAGE_BODY_TYPE_VALUE) {
      *body_amqp_value = message->body_amqp_value;
      iVar3 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x4e1;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_body_amqp_value_in_place",0x4e0,1,"Body is not of type AMQP value");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_body_amqp_value_in_place(MESSAGE_HANDLE message, AMQP_VALUE* body_amqp_value)
{
    int result;

    if ((message == NULL) ||
        (body_amqp_value == NULL))
    {
        /* Codes_SRS_MESSAGE_01_108: [ If `message` or `body_amqp_value` is NULL, `message_get_body_amqp_value_in_place` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, body_amqp_value = %p",
            message, body_amqp_value);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_VALUE)
        {
            /* Codes_SRS_MESSAGE_01_109: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_VALUE`, `message_get_body_amqp_value_in_place` shall fail and return a non-zero value. ]*/
            LogError("Body is not of type AMQP value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_106: [ `message_get_body_amqp_value_in_place` shall get the body AMQP value for the message instance identified by `message` in place (not cloning) into the `body_amqp_value` argument. ]*/
            *body_amqp_value = message->body_amqp_value;

            /* Codes_SRS_MESSAGE_01_107: [ On success, `message_get_body_amqp_value_in_place` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}